

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Householder.h
# Opt level: O3

void __thiscall
Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,2,-1,true>>::
applyHouseholderOnTheRight<Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,2,1,true>,_1,1,false>>
          (MatrixBase<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,2,_1,true>> *this,
          Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>
          *essential,Scalar *tau,Scalar *workspace)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  Scalar *tmp_2;
  Map<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_> tmp_1;
  SelfCwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,__1,_0,_2,_2>_>_>
  tmp;
  SelfCwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_2,__1,_false>,_Eigen::CoeffBasedProduct<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>_>,_256>_>
  tmp_3;
  scalar_difference_op<double> local_121;
  double *local_120 [2];
  undefined1 local_110 [16];
  double local_100;
  PointerType local_f8;
  long local_e8;
  undefined8 local_e0;
  Index IStack_d8;
  Index local_d0;
  undefined1 local_c8 [8];
  variable_if_dynamic<long,__1> vStack_c0;
  scalar_constant_op<double> local_b8;
  variable_if_dynamic<long,__1> vStack_b0;
  variable_if_dynamic<long,__1> local_a0;
  Nested local_98;
  Nested pMStack_90;
  Index local_88;
  PointerType local_80;
  variable_if_dynamic<long,__1> vStack_78;
  PointerType local_68;
  Nested local_58;
  Index IStack_50;
  Index local_48;
  SelfCwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_2,__1,_false>,_Eigen::CoeffBasedProduct<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>_>,_256>_>
  local_28;
  
  local_e8 = *(long *)(this + 0x10);
  if (local_e8 == 1) {
    local_b8.m_other = 1.0 - *tau;
    local_110._8_8_ = local_c8;
    vStack_c0.m_value = 1;
    local_110._0_8_ = this;
    SelfCwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_-1,_true>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_-1,_0,_2,_2>_>_>
    ::operator=((SelfCwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,__1,_0,_2,_2>_>_>
                 *)local_110,
                (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,__1,_0,_2,_2>_>
                 *)local_c8);
  }
  else {
    local_100 = (double)(local_e8 + -1);
    local_f8 = *(PointerType *)this;
    local_110._0_8_ = local_f8 + *(long *)(this + 0x20);
    local_120[0] = workspace;
    if (local_e8 < 1 &&
        (Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true> *)local_110._0_8_ !=
        (Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true> *)0x0) {
      __assert_fail("(dataPtr == 0) || ( nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/Core/MapBase.h"
                    ,0x94,
                    "Eigen::MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double, 2, 2>, 2, -1, true>, 2>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Block<Eigen::Matrix<double, 2, 2>, 2, -1, true>, 2>, Level = 0]"
                   );
    }
    local_e0 = *(undefined8 *)(this + 0x18);
    IStack_d8 = *(Index *)(this + 0x20);
    local_d0 = IStack_d8;
    if (local_e8 < 1) {
      __assert_fail("a_startRow >= 0 && blockRows >= 0 && a_startRow <= xpr.rows() - blockRows && a_startCol >= 0 && blockCols >= 0 && a_startCol <= xpr.cols() - blockCols"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/Core/Block.h"
                    ,0x8d,
                    "Eigen::Block<Eigen::Block<Eigen::Matrix<double, 2, 2>, 2, -1, true>, 2>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Block<Eigen::Matrix<double, 2, 2>, 2, -1, true>, BlockRows = 2, BlockCols = -1, InnerPanel = false]"
                   );
    }
    local_98 = *(Nested *)(this + 0x18);
    pMStack_90 = *(Nested *)(this + 0x20);
    local_80 = (essential->
               super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_Eigen::Dense>
               ).
               super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_true>
               .
               super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>,_1>
               .
               super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>,_0>
               .m_data;
    vStack_78.m_value =
         (essential->
         super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_Eigen::Dense>
         ).
         super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_true>
         .
         super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>,_1>
         .
         super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>,_0>
         .m_rows.m_value;
    local_68 = (essential->
               super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_Eigen::Dense>
               ).
               super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_true>
               .m_xpr.
               super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true,_Eigen::Dense>.
               super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true,_true>.
               super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,_1>.
               super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,_0>.
               m_data;
    local_58 = (essential->
               super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_Eigen::Dense>
               ).
               super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_true>
               .m_xpr.
               super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true,_Eigen::Dense>.
               super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true,_true>.m_xpr;
    IStack_50 = (essential->
                super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_Eigen::Dense>
                ).
                super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_true>
                .m_xpr.
                super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true,_Eigen::Dense>.
                super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true,_true>.
                m_outerStride;
    local_48 = (essential->
               super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_Eigen::Dense>
               ).
               super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_true>
               .m_outerStride;
    local_c8 = (undefined1  [8])local_110._0_8_;
    local_b8.m_other = local_100;
    vStack_b0.m_value = (long)local_f8;
    local_a0.m_value = local_e8;
    local_88 = IStack_d8;
    if (local_100 !=
        (double)(essential->
                super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_Eigen::Dense>
                ).
                super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_true>
                .
                super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>,_1>
                .
                super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>,_0>
                .m_rows.m_value) {
      __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/Core/products/CoeffBasedProduct.h"
                    ,0x9e,
                    "Eigen::CoeffBasedProduct<const Eigen::Block<Eigen::Block<Eigen::Matrix<double, 2, 2>, 2, -1, true>, 2>, const Eigen::Block<Eigen::Block<Eigen::Matrix<double, 2, 2>, 2, 1, true>, -1, 1>, 6>::CoeffBasedProduct(const Lhs &, const Rhs &) [Lhs = const Eigen::Block<Eigen::Block<Eigen::Matrix<double, 2, 2>, 2, -1, true>, 2>, Rhs = const Eigen::Block<Eigen::Block<Eigen::Matrix<double, 2, 2>, 2, 1, true>, -1, 1>, NestingFlags = 6, Lhs = Eigen::Block<Eigen::Block<Eigen::Matrix<double, 2, 2>, 2, -1, true>, 2>, Rhs = Eigen::Block<Eigen::Block<Eigen::Matrix<double, 2, 2>, 2, 1, true>, -1, 1>]"
                   );
    }
    internal::
    assign_selector<Eigen::Map<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::CoeffBasedProduct<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_-1,_true>,_2,_-1,_false>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,_-1,_1,_false>,_6>,_false,_false>
    ::run((Map<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_> *)local_120,
          (CoeffBasedProduct<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_2,__1,_false>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>,_6>
           *)local_c8);
    pdVar4 = *(double **)this;
    if (((ulong)pdVar4 & 0xf) != 0) {
      __assert_fail("(!(internal::traits<Derived>::Flags&AlignedBit) || ((size_t(m_data) % 16) == 0)) && \"input pointer is not aligned on a 16 byte boundary\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/Core/MapBase.h"
                    ,0xa4,
                    "void Eigen::MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double, 2, 2>, 2, -1, true>, 2, 1, true>, 0>::checkSanity() const [Derived = Eigen::Block<Eigen::Block<Eigen::Matrix<double, 2, 2>, 2, -1, true>, 2, 1, true>, Level = 0]"
                   );
    }
    if (*(long *)(this + 0x10) < 1) {
      __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/Core/Block.h"
                    ,0x76,
                    "Eigen::Block<Eigen::Block<Eigen::Matrix<double, 2, 2>, 2, -1, true>, 2, 1, true>::Block(XprType &, Index) [XprType = Eigen::Block<Eigen::Matrix<double, 2, 2>, 2, -1, true>, BlockRows = 2, BlockCols = 1, InnerPanel = true]"
                   );
    }
    dVar1 = *local_120[0];
    dVar2 = *pdVar4;
    *local_120[0] = dVar1 + dVar2;
    local_120[0][1] = local_120[0][1] + pdVar4[1];
    dVar3 = *tau;
    *pdVar4 = *pdVar4 - (dVar1 + dVar2) * dVar3;
    pdVar4[1] = pdVar4[1] - dVar3 * local_120[0][1];
    local_a0.m_value =
         (long)(essential->
               super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_Eigen::Dense>
               ).
               super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_true>
               .m_xpr.
               super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true,_Eigen::Dense>.
               super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true,_true>.
               super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,_1>.
               super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,_0>.
               m_data;
    local_80 = (PointerType)
               (essential->
               super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_Eigen::Dense>
               ).
               super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_true>
               .m_outerStride;
    local_c8 = (undefined1  [8])(*tau * *local_120[0]);
    vStack_c0.m_value = (long)(*tau * local_120[0][1]);
    local_b8.m_other =
         (double)(essential->
                 super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_Eigen::Dense>
                 ).
                 super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_true>
                 .
                 super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>,_1>
                 .
                 super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>,_0>
                 .m_data;
    vStack_b0.m_value =
         (essential->
         super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_Eigen::Dense>
         ).
         super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_true>
         .
         super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>,_1>
         .
         super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>,_0>
         .m_rows.m_value;
    pMStack_90 = (essential->
                 super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_Eigen::Dense>
                 ).
                 super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_true>
                 .m_xpr.
                 super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true,_Eigen::Dense>.
                 super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true,_true>.m_xpr
    ;
    local_88 = (essential->
               super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_Eigen::Dense>
               ).
               super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_true>
               .m_xpr.
               super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true,_Eigen::Dense>.
               super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true,_true>.
               m_outerStride;
    local_58 = (Nested)0x0;
    local_28.m_matrix =
         (Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_2,__1,_false> *)
         local_110;
    local_28.m_functor = &local_121;
    SelfCwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_-1,_true>,_2,_-1,_false>,_Eigen::CoeffBasedProduct<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,_-1,_1,_false>_>,_256>_>
    ::operator=(&local_28,
                (CoeffBasedProduct<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>_>,_256>
                 *)local_c8);
  }
  return;
}

Assistant:

void MatrixBase<Derived>::applyHouseholderOnTheRight(
  const EssentialPart& essential,
  const Scalar& tau,
  Scalar* workspace)
{
  if(cols() == 1)
  {
    *this *= Scalar(1)-tau;
  }
  else
  {
    Map<typename internal::plain_col_type<PlainObject>::type> tmp(workspace,rows());
    Block<Derived, Derived::RowsAtCompileTime, EssentialPart::SizeAtCompileTime> right(derived(), 0, 1, rows(), cols()-1);
    tmp.noalias() = right * essential.conjugate();
    tmp += this->col(0);
    this->col(0) -= tau * tmp;
    right.noalias() -= tau * tmp * essential.transpose();
  }
}